

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::UdpFieldBaseSyntax::isKind(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  if ((kind == UdpEdgeField) || (kind == UdpSimpleField)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool UdpFieldBaseSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::UdpEdgeField:
        case SyntaxKind::UdpSimpleField:
            return true;
        default:
            return false;
    }
}